

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall FIX::DataDictionary::addHeaderField(DataDictionary *this,int field,bool required)

{
  mapped_type *pmVar1;
  value_type_conflict1 local_14;
  
  if (this[0xd] == (DataDictionary)0x1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)(this + 0x348),&local_14);
  }
  pmVar1 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                       *)(this + 0x168),&local_14);
  *pmVar1 = required;
  return;
}

Assistant:

void addHeaderField( int field, bool required )
  {
    if (m_storeMsgFieldsOrder)
    {
      m_headerOrderedFields.push_back(field);
    }

    m_headerFields[ field ] = required;
  }